

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O0

uint64_t __thiscall filehandle::size(filehandle *this)

{
  int iVar1;
  system_error *psVar2;
  int *piVar3;
  error_category *peVar4;
  runtime_error *this_00;
  filehandle *local_c0;
  uint64_t devsize;
  undefined1 local_a8 [8];
  stat st;
  filehandle *this_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)this;
  iVar1 = fh(this);
  iVar1 = fstat(iVar1,(stat *)local_a8);
  if (iVar1 != 0) {
    psVar2 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(psVar2,iVar1,peVar4,"fstat");
    __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  if (((uint)st.st_nlink & 0x8000) == 0) {
    if (((uint)st.st_nlink & 0x6000) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"size not implemented for pipe or socket");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = fh(this);
    iVar1 = ioctl(iVar1,0x80081272,&local_c0);
    if (iVar1 == -1) {
      psVar2 = (system_error *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      peVar4 = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(psVar2,iVar1,peVar4,"ioctl(BLKGETSIZE64)");
      __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    this_local = local_c0;
  }
  else {
    this_local = (filehandle *)st.st_rdev;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t size()
    {
        struct stat st;
        if (fstat(fh(), &st))
            throw std::system_error(errno, std::generic_category(), "fstat");

        if (st.st_mode&S_IFREG)
            return st.st_size;
#ifndef _WIN32
        else if (st.st_mode&S_IFBLK) {
#ifdef DKIOCGETBLOCKCOUNT
            uint64_t bkcount;
            uint32_t bksize;
            if (-1==ioctl(fh(), DKIOCGETBLOCKCOUNT, &bkcount))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKCOUNT)");
            if (-1==ioctl(fh(), DKIOCGETBLOCKSIZE, &bksize))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKSIZE)");
            return bkcount*bksize;
#elif defined(BLKGETSIZE64)
            uint64_t devsize;
            if (-1==ioctl(fh(), BLKGETSIZE64, &devsize))
                throw std::system_error(errno, std::generic_category(), "ioctl(BLKGETSIZE64)");
            return devsize;
#else
            throw std::runtime_error("size not implemented for block dev");
#endif
        }
#endif
        else {
            // pipe or socket
            throw std::runtime_error("size not implemented for pipe or socket");
        }